

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::EqualTest<char,unsigned_int>(void)

{
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_31;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_30;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2f;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2e;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2d;
  int local_2c [3];
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  int local_1c [3];
  
  local_1c[2] = 3;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_2d,local_1c + 2);
  if (local_2d.m_int == '\x02') {
    local_1c[1] = 4;
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_2e,local_1c + 1);
    if (local_2e.m_int == '\x05') {
      local_1c[0] = 6;
      SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_2f,local_1c);
      local_2c[2] = 7;
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_20,local_2c + 2);
      if ((long)local_2f.m_int == (ulong)local_20.m_int) {
        local_2c[1] = 1;
        SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                  (&local_30,local_2c + 1);
        if (local_30.m_int != '\0') {
          local_2c[0] = 0;
          SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                    (&local_31,local_2c);
          return local_31.m_int == '\0';
        }
      }
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool EqualTest()
	{
		return
			(U)2 == SafeInt<T>(3) &&
			SafeInt<T>(4) == (U)5 &&
			SafeInt<T>(6) == SafeInt<U>(7) &&
			true == SafeInt<T>(1) &&
			false == SafeInt<T>(0);
	}